

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebyshevII.cpp
# Opt level: O0

void __thiscall
Iir::ChebyshevII::AnalogLowPass::design(AnalogLowPass *this,int numPoles,double stopBandDb)

{
  complex_t *pcVar1;
  uint in_ESI;
  LayoutBase *in_RDI;
  PoleZeroPair *in_XMM0_Qa;
  double dVar2;
  LayoutBase *this_00;
  complex_t *pole;
  double dVar3;
  double dVar4;
  double im;
  double d2;
  double b;
  double a;
  int i;
  int k;
  double fn;
  double cosh_v0;
  double sinh_v0;
  double v0;
  double eps;
  double in_stack_ffffffffffffff40;
  complex<double> local_98;
  complex<double> local_88;
  complex<double> local_78;
  double local_68;
  complex_t *in_stack_ffffffffffffffa0;
  complex_t *in_stack_ffffffffffffffa8;
  LayoutBase *in_stack_ffffffffffffffb0;
  int local_48;
  int local_44;
  complex_t *zero;
  
  if (((in_RDI[1].m_numPoles != in_ESI) || ((double)in_RDI[1].m_pair != (double)in_XMM0_Qa)) ||
     (NAN((double)in_RDI[1].m_pair) || NAN((double)in_XMM0_Qa))) {
    in_RDI[1].m_numPoles = in_ESI;
    in_RDI[1].m_pair = in_XMM0_Qa;
    LayoutBase::reset(in_RDI);
    dVar2 = exp((double)in_XMM0_Qa * 0.1 * 2.302585092994046);
    this_00 = (LayoutBase *)sqrt(1.0 / (dVar2 - 1.0));
    dVar2 = asinh<double>(in_stack_ffffffffffffff40);
    pole = (complex_t *)(dVar2 / (double)(int)in_ESI);
    dVar2 = sinh((double)pole);
    pcVar1 = (complex_t *)((ulong)dVar2 ^ 0x8000000000000000);
    dVar2 = cosh((double)pole);
    dVar3 = 3.141592653589793 / (double)(int)(in_ESI << 1);
    local_44 = 1;
    local_48 = (int)in_ESI / 2;
    while (local_48 = local_48 + -1, -1 < local_48) {
      zero = pcVar1;
      dVar4 = cos((double)(int)(local_44 - in_ESI) * dVar3);
      in_stack_ffffffffffffffb0 = (LayoutBase *)((double)pcVar1 * dVar4);
      dVar4 = sin((double)(int)(local_44 - in_ESI) * dVar3);
      in_stack_ffffffffffffffa8 = (complex_t *)(dVar2 * dVar4);
      in_stack_ffffffffffffffa0 =
           (complex_t *)
           ((double)in_stack_ffffffffffffffb0 * (double)in_stack_ffffffffffffffb0 +
           (double)in_stack_ffffffffffffffa8 * (double)in_stack_ffffffffffffffa8);
      local_68 = cos((double)local_44 * dVar3);
      local_68 = 1.0 / local_68;
      std::complex<double>::complex
                (&local_78,(double)in_stack_ffffffffffffffb0 / (double)in_stack_ffffffffffffffa0,
                 (double)in_stack_ffffffffffffffa8 / (double)in_stack_ffffffffffffffa0);
      std::complex<double>::complex(&local_88,0.0,local_68);
      LayoutBase::addPoleZeroConjugatePairs(this_00,pole,zero);
      local_44 = local_44 + 2;
      pcVar1 = zero;
    }
    if ((in_ESI & 1) != 0) {
      std::complex<double>::complex(&local_98,1.0 / (double)pcVar1,0.0);
      infinity();
      LayoutBase::add(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0)
      ;
    }
  }
  return;
}

Assistant:

void AnalogLowPass::design (int numPoles,
                            double stopBandDb)
{
  if (m_numPoles != numPoles ||
      m_stopBandDb != stopBandDb)
  {
    m_numPoles = numPoles;
    m_stopBandDb = stopBandDb;

    reset ();

    const double eps = std::sqrt (1. / (std::exp (stopBandDb * 0.1 * doubleLn10) - 1));
    const double v0 = asinh (1 / eps) / numPoles;
    const double sinh_v0 = -sinh (v0);
    const double cosh_v0 = cosh (v0);
    const double fn = doublePi / (2 * numPoles);

    int k = 1;
    for (int i = numPoles / 2; --i >= 0; k+=2)
    {
      const double a = sinh_v0 * cos ((k - numPoles) * fn);
      const double b = cosh_v0 * sin ((k - numPoles) * fn);
      const double d2 = a * a + b * b;
      const double im = 1 / cos (k * fn);
      addPoleZeroConjugatePairs (complex_t (a / d2, b / d2),
                                       complex_t (0, im));
    }

    if (numPoles & 1)
    {
      add (1 / sinh_v0, infinity());
    }
  }
}